

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batched_data_collection.cpp
# Opt level: O1

idx_t __thiscall duckdb::BatchedDataCollection::Count(BatchedDataCollection *this)

{
  pointer pCVar1;
  _Rb_tree_node_base *p_Var2;
  idx_t iVar3;
  
  iVar3 = 0;
  for (p_Var2 = (this->data)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->data)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var2)) {
    pCVar1 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
             ::operator->((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                           *)&p_Var2[1]._M_parent);
    iVar3 = iVar3 + pCVar1->count;
  }
  return iVar3;
}

Assistant:

idx_t BatchedDataCollection::Count() const {
	idx_t count = 0;
	for (auto &collection : data) {
		count += collection.second->Count();
	}
	return count;
}